

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_vacuum.cpp
# Opt level: O1

unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> __thiscall
duckdb::Transformer::TransformVacuum(Transformer *this,PGVacuumStmt *stmt)

{
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var2;
  VacuumOptions VVar3;
  unique_ptr<duckdb::VacuumStatement,_std::default_delete<duckdb::VacuumStatement>_> this_00;
  pointer pVVar4;
  pointer pVVar5;
  long in_RDX;
  pointer *__ptr;
  long *plVar6;
  optional_ptr<duckdb_libpgquery::PGValue,_true> value;
  templated_unique_single_t result;
  VacuumOptions local_38;
  undefined6 uStack_36;
  _Head_base<0UL,_duckdb::VacuumStatement_*,_false> local_30;
  
  VVar3 = ParseOptions(*(int32_t *)(in_RDX + 4));
  local_38 = VVar3;
  this_00._M_t.
  super___uniq_ptr_impl<duckdb::VacuumStatement,_std::default_delete<duckdb::VacuumStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::VacuumStatement_*,_std::default_delete<duckdb::VacuumStatement>_>.
  super__Head_base<0UL,_duckdb::VacuumStatement_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::VacuumStatement,_std::default_delete<duckdb::VacuumStatement>,_true,_true>
        )operator_new(0x80);
  VacuumStatement::VacuumStatement
            ((VacuumStatement *)
             this_00._M_t.
             super___uniq_ptr_impl<duckdb::VacuumStatement,_std::default_delete<duckdb::VacuumStatement>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::VacuumStatement_*,_std::default_delete<duckdb::VacuumStatement>_>
             .super__Head_base<0UL,_duckdb::VacuumStatement_*,_false>._M_head_impl,
             &stack0xffffffffffffffc8);
  local_30._M_head_impl =
       (VacuumStatement *)
       this_00._M_t.
       super___uniq_ptr_impl<duckdb::VacuumStatement,_std::default_delete<duckdb::VacuumStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::VacuumStatement_*,_std::default_delete<duckdb::VacuumStatement>_>
       .super__Head_base<0UL,_duckdb::VacuumStatement_*,_false>._M_head_impl;
  if (*(long *)(in_RDX + 8) != 0) {
    TransformRangeVar((Transformer *)&stack0xffffffffffffffc8,(PGRangeVar *)stmt);
    pVVar4 = unique_ptr<duckdb::VacuumStatement,_std::default_delete<duckdb::VacuumStatement>,_true>
             ::operator->((unique_ptr<duckdb::VacuumStatement,_std::default_delete<duckdb::VacuumStatement>,_true>
                           *)&stack0xffffffffffffffd0);
    pVVar5 = unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::
             operator->(&pVVar4->info);
    _Var2._M_head_impl = _local_38;
    _local_38 = (TableRef *)0x0;
    _Var1._M_head_impl =
         (pVVar5->ref).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
         _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pVVar5->ref).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
    }
    if ((Transformer *)_local_38 != (Transformer *)0x0) {
      (*(code *)((((Transformer *)_local_38)->parent).ptr)->options)();
    }
    pVVar4 = unique_ptr<duckdb::VacuumStatement,_std::default_delete<duckdb::VacuumStatement>,_true>
             ::operator->((unique_ptr<duckdb::VacuumStatement,_std::default_delete<duckdb::VacuumStatement>,_true>
                           *)&stack0xffffffffffffffd0);
    pVVar5 = unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::
             operator->(&pVVar4->info);
    pVVar5->has_table = true;
  }
  if ((*(long *)(in_RDX + 0x10) != 0) &&
     (plVar6 = *(long **)(*(long *)(in_RDX + 0x10) + 8), plVar6 != (long *)0x0)) {
    do {
      _local_38 = (TableRef *)*plVar6;
      pVVar4 = unique_ptr<duckdb::VacuumStatement,_std::default_delete<duckdb::VacuumStatement>,_true>
               ::operator->((unique_ptr<duckdb::VacuumStatement,_std::default_delete<duckdb::VacuumStatement>,_true>
                             *)&stack0xffffffffffffffd0);
      pVVar5 = unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::
               operator->(&pVVar4->info);
      optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&stack0xffffffffffffffc8);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &pVVar5->columns,(char **)&((Transformer *)_local_38)->options);
      plVar6 = (long *)plVar6[1];
    } while (plVar6 != (long *)0x0);
  }
  (this->parent).ptr = (Transformer *)local_30._M_head_impl;
  return (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)
         (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)this;
}

Assistant:

unique_ptr<SQLStatement> Transformer::TransformVacuum(duckdb_libpgquery::PGVacuumStmt &stmt) {
	auto result = make_uniq<VacuumStatement>(ParseOptions(stmt.options));

	if (stmt.relation) {
		result->info->ref = TransformRangeVar(*stmt.relation);
		result->info->has_table = true;
	}

	if (stmt.va_cols) {
		D_ASSERT(result->info->has_table);
		for (auto col_node = stmt.va_cols->head; col_node != nullptr; col_node = col_node->next) {
			auto value = PGPointerCast<duckdb_libpgquery::PGValue>(col_node->data.ptr_value);
			result->info->columns.emplace_back(value->val.str);
		}
	}
	return std::move(result);
}